

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O1

AssertionResult * __thiscall
iutest::internal::CmpHelperEQ<Bar,Bar>
          (AssertionResult *__return_storage_ptr__,internal *this,char *expected_str,
          char *actual_str,Bar *expected,Bar *actual)

{
  Bar *pBVar1;
  string local_68;
  string local_48;
  
  if (((expected->x == *(int *)actual_str) && (expected->y == *(int *)(actual_str + 4))) &&
     (expected->z == *(int *)(actual_str + 8))) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    pBVar1 = (Bar *)actual_str;
    FormatForComparisonFailureMessage<Bar,Bar>
              (&local_48,(internal *)actual_str,expected,(Bar *)actual_str);
    FormatForComparisonFailureMessage<Bar,Bar>
              (&local_68,(internal *)expected,(Bar *)actual_str,pBVar1);
    EqFailure(__return_storage_ptr__,(char *)this,expected_str,&local_48,&local_68,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( iuOperatorEQ(actual, expected) )
    {
        return AssertionSuccess();
    }